

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cards.cpp
# Opt level: O2

void __thiscall Deck::draw(Deck *this,Hand *userHand)

{
  vector<CardType,_std::allocator<CardType>_> *pvVar1;
  pointer pCVar2;
  CardType drawnCard;
  value_type local_14;
  
  pvVar1 = this->deckPointer;
  pCVar2 = (pvVar1->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
           super__Vector_impl_data._M_finish + -1;
  (pvVar1->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.super__Vector_impl_data.
  _M_finish = pCVar2;
  setNumberOfCards(this,(int)((ulong)((long)pCVar2 -
                                     (long)(pvVar1->
                                           super__Vector_base<CardType,_std::allocator<CardType>_>).
                                           _M_impl.super__Vector_impl_data._M_start) >> 2));
  std::vector<CardType,_std::allocator<CardType>_>::push_back(userHand->handPointer,&local_14);
  return;
}

Assistant:

void Deck::draw(Hand& userHand) {
    CardType drawnCard = deckPointer->back();
    deckPointer->pop_back();
    Deck::setNumberOfCards(deckPointer->size());
    userHand.getHand()->push_back(drawnCard);
}